

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O2

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Parser,false>
          (IntResult *__return_storage_ptr__,NumberParser *this,Parser *stream)

{
  undefined8 uVar1;
  Info *pIVar2;
  undefined8 uVar3;
  Info *pIVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  SourceLocation SVar8;
  int iVar9;
  Token TVar10;
  Token TVar11;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar12;
  Token sizeToken_00;
  Token local_c8;
  Token first;
  Token local_98;
  Token sizeToken;
  Token token;
  uint local_68;
  Token local_40;
  
  TVar10 = ParserBase::getLastConsumed(&stream->super_ParserBase);
  Token::Token(&sizeToken);
  Token::Token(&local_c8);
  TVar11 = ParserBase::consume(&stream->super_ParserBase);
  token = TVar11;
  if (TVar11.kind == IntegerBase) {
    local_c8 = TVar11;
    Token::Token(&local_40);
  }
  else {
    first.info = (Info *)&token;
    first._0_8_ = this;
    bVar6 = ParserBase::peek(&stream->super_ParserBase,IntegerBase);
    TVar11 = token;
    if (!bVar6) {
      parseInteger<slang::parsing::Parser,_false>::anon_class_16_2_f88ffae6::operator()
                (__return_storage_ptr__,(anon_class_16_2_f88ffae6 *)&first);
      return __return_storage_ptr__;
    }
    sizeToken.kind = token.kind;
    sizeToken._2_1_ = token._2_1_;
    sizeToken.numFlags.raw = token.numFlags.raw;
    sizeToken.rawLen = token.rawLen;
    sizeToken.info = token.info;
    token = TVar11;
    TVar11 = ParserBase::consume(&stream->super_ParserBase);
    local_40._0_8_ = sizeToken._0_8_;
    local_40.info = sizeToken.info;
    local_c8 = TVar11;
  }
  sizeToken_00.info = local_40.info;
  sizeToken_00.kind = local_40.kind;
  sizeToken_00._2_1_ = local_40._2_1_;
  sizeToken_00.numFlags.raw = local_40.numFlags.raw;
  sizeToken_00.rawLen = local_40.rawLen;
  startVector(this,TVar11,sizeToken_00);
  first = ParserBase::peek(&stream->super_ParserBase);
  bVar6 = syntax::SyntaxFacts::isPossibleVectorDigit(first.kind);
  if (bVar6) {
    local_68 = TVar10._0_4_ & 0xffff;
    local_98 = first;
    SVar8 = Token::location(&first);
    this->firstLocation = SVar8;
    iVar5 = 0;
    do {
      iVar9 = iVar5;
      uVar7 = append(this,local_98,iVar9 == 0);
      ParserBase::consume(&stream->super_ParserBase);
      if (-1 < (int)uVar7) {
        Parser::handleExponentSplit(stream,local_98,(ulong)uVar7);
        bVar6 = false;
        goto LAB_001bb159;
      }
      local_98 = ParserBase::peek(&stream->super_ParserBase);
      bVar6 = syntax::SyntaxFacts::isPossibleVectorDigit(local_98.kind);
    } while ((bVar6) &&
            (sVar12 = Token::trivia(&local_98), iVar5 = iVar9 + -1,
            sVar12._M_extent._M_extent_value._M_extent_value == 0));
    bVar6 = iVar9 == 0;
LAB_001bb159:
    pIVar4 = sizeToken.info;
    uVar3 = sizeToken._0_8_;
    uVar1 = local_c8._0_8_;
    pIVar2 = local_c8.info;
    TVar11 = finishValue(this,first,bVar6,local_68 == 0x23);
    sizeToken.kind = (TokenKind)uVar3;
    sizeToken._2_1_ = SUB81(uVar3,2);
    sizeToken.numFlags.raw = SUB81(uVar3,3);
    sizeToken.rawLen = SUB84(uVar3,4);
    (__return_storage_ptr__->size).kind = sizeToken.kind;
    (__return_storage_ptr__->size).field_0x2 = sizeToken._2_1_;
    (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)sizeToken.numFlags.raw;
    (__return_storage_ptr__->size).rawLen = sizeToken.rawLen;
    (__return_storage_ptr__->size).info = pIVar4;
    local_c8.kind = (TokenKind)uVar1;
    local_c8._2_1_ = SUB81(uVar1,2);
    local_c8.numFlags.raw = SUB81(uVar1,3);
    local_c8.rawLen = SUB84(uVar1,4);
    (__return_storage_ptr__->base).kind = local_c8.kind;
    (__return_storage_ptr__->base).field_0x2 = local_c8._2_1_;
    (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)local_c8.numFlags.raw;
    (__return_storage_ptr__->base).rawLen = local_c8.rawLen;
    (__return_storage_ptr__->base).info = pIVar2;
    __return_storage_ptr__->value = TVar11;
    __return_storage_ptr__->isSimple = false;
  }
  else {
    TVar11.info = sizeToken.info;
    TVar11.kind = sizeToken.kind;
    TVar11._2_1_ = sizeToken._2_1_;
    TVar11.numFlags.raw = sizeToken.numFlags.raw;
    TVar11.rawLen = sizeToken.rawLen;
    reportMissingDigits(__return_storage_ptr__,this,TVar11,local_c8,first);
  }
  return __return_storage_ptr__;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }